

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIterator<const_char_*> * __thiscall
testing::internal::ParamIterator<const_char_*>::operator=
          (ParamIterator<const_char_*> *this,ParamIterator<const_char_*> *other)

{
  int iVar1;
  pointer pPVar2;
  undefined4 extraout_var;
  ParamIterator<const_char_*> *other_local;
  ParamIterator<const_char_*> *this_local;
  
  if (this != other) {
    pPVar2 = std::
             unique_ptr<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
             ::operator->(&other->impl_);
    iVar1 = (*pPVar2->_vptr_ParamIteratorInterface[4])();
    std::
    unique_ptr<testing::internal::ParamIteratorInterface<const_char_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_char_*>_>_>
    ::reset(&this->impl_,(pointer)CONCAT44(extraout_var,iVar1));
  }
  return this;
}

Assistant:

ParamIterator& operator=(const ParamIterator& other) {
    if (this != &other) impl_.reset(other.impl_->Clone());
    return *this;
  }